

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallGetRuntimeDependenciesGenerator::GenerateScript
          (cmInstallGetRuntimeDependenciesGenerator *this,ostream *os)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  string local_68;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
  __n = (this->FrameworkComponent)._M_string_length;
  if (__n == 0) {
LAB_003a2174:
    cmInstallGenerator::CreateComponentTest
              (&local_68,&this->super_cmInstallGenerator,&this->LibraryComponent,
               (this->super_cmInstallGenerator).ExcludeFromAll,false);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_68._M_dataplus._M_p,local_68._M_string_length);
  }
  else {
    if (__n == (this->LibraryComponent)._M_string_length) {
      iVar1 = bcmp((this->FrameworkComponent)._M_dataplus._M_p,
                   (this->LibraryComponent)._M_dataplus._M_p,__n);
      if (iVar1 == 0) goto LAB_003a2174;
    }
    cmInstallGenerator::CreateComponentTest
              (&local_68,&this->super_cmInstallGenerator,&this->LibraryComponent,true,false);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," OR ",4);
    cmInstallGenerator::CreateComponentTest
              (&local_48,&this->super_cmInstallGenerator,&this->FrameworkComponent,
               (this->super_cmInstallGenerator).ExcludeFromAll,false);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  (*(this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator[3])(this,os,2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n\n",9);
  return;
}

Assistant:

void cmInstallGetRuntimeDependenciesGenerator::GenerateScript(std::ostream& os)
{
  // Track indentation.
  Indent indent;

  // Begin this block of installation.
  os << indent << "if(";
  if (this->FrameworkComponent.empty() ||
      this->FrameworkComponent == this->LibraryComponent) {
    os << this->CreateComponentTest(this->LibraryComponent,
                                    this->ExcludeFromAll);
  } else {
    os << this->CreateComponentTest(this->LibraryComponent, true) << " OR "
       << this->CreateComponentTest(this->FrameworkComponent,
                                    this->ExcludeFromAll);
  }
  os << ")\n";

  // Generate the script possibly with per-configuration code.
  this->GenerateScriptConfigs(os, indent.Next());

  // End this block of installation.
  os << indent << "endif()\n\n";
}